

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall
fast_float::stackvec<(unsigned_short)62>::try_extend(stackvec<(unsigned_short)62> *this,limb_span s)

{
  ulong uVar1;
  ushort uVar2;
  size_t sVar3;
  unsigned_long __n2;
  
  sVar3 = s.length;
  uVar2 = this->length;
  uVar1 = uVar2 + sVar3;
  if (uVar1 < 0x3f) {
    if (sVar3 != 0) {
      memmove(this->data + uVar2,s.ptr,sVar3 * 8);
      uVar2 = this->length;
    }
    this->length = uVar2 + (short)s.length;
  }
  return uVar1 < 0x3f;
}

Assistant:

constexpr size_t len() const noexcept {
    return length;
  }